

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.hpp
# Opt level: O0

mutable_buffer io::net::buffer<char,std::allocator<char>>(vector<char,_std::allocator<char>_> *data)

{
  bool bVar1;
  size_t n;
  mutable_buffer mVar2;
  reference local_68;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_48;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_40;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_38;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_30;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_28;
  vector<char,_std::allocator<char>_> *local_20;
  vector<char,_std::allocator<char>_> *data_local;
  
  local_20 = data;
  local_28._M_current = (char *)std::begin<std::vector<char,std::allocator<char>>>(data);
  local_30._M_current = (char *)std::end<std::vector<char,std::allocator<char>>>(local_20);
  bVar1 = __gnu_cxx::operator!=(&local_28,&local_30);
  if (bVar1) {
    local_38._M_current = (char *)std::begin<std::vector<char,std::allocator<char>>>(local_20);
    local_68 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
               operator*(&local_38);
  }
  else {
    local_68 = (reference)0x0;
  }
  local_40._M_current = (char *)std::end<std::vector<char,std::allocator<char>>>(local_20);
  local_48._M_current = (char *)std::begin<std::vector<char,std::allocator<char>>>(local_20);
  n = __gnu_cxx::operator-(&local_40,&local_48);
  mVar2 = buffer(local_68,n);
  return mVar2;
}

Assistant:

mutable_buffer buffer(std::vector<T, Allocator>& data) noexcept
{
    return buffer(std::begin(data) != std::end(data) ? std::addressof(*std::begin(data)) : nullptr,
                  (std::end(data) - std::begin(data)) * sizeof(*std::begin(data)));
}